

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

TestCaseGroup * vkt::memory::createPipelineBarrierTests(TestContext *testCtx)

{
  Usage UVar1;
  undefined8 uVar2;
  Usage UVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  char *pcVar6;
  TestNode *pTVar7;
  InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
  *pIVar8;
  TestNode *pTVar9;
  Usage usage_00;
  AddPrograms local_2a1;
  undefined1 local_2a0 [8];
  TestConfig_conflict1 config_2;
  undefined1 local_280 [8];
  string testName_2;
  VkDeviceSize size_2;
  size_t sizeNdx_2;
  undefined1 local_248 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> usageGroup_2;
  string local_230 [8];
  string usageGroupName_2;
  undefined1 local_208 [8];
  TestConfig_conflict1 config_1;
  undefined1 local_1e8 [8];
  string testName_1;
  VkDeviceSize size_1;
  size_t sizeNdx_1;
  undefined1 local_1b0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> usageGroup_1;
  string local_198 [8];
  string usageGroupName_1;
  size_t usageNdx;
  Usage all;
  TestConfig_conflict1 config;
  undefined1 local_148 [8];
  string testName;
  VkDeviceSize size;
  size_t sizeNdx;
  undefined1 local_110 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> usageGroup;
  string usageGroupName;
  Usage usage;
  Usage readUsage;
  size_t readUsageNdx;
  ulong uStack_c8;
  Usage writeUsage;
  size_t writeUsageNdx;
  Usage writeUsages [2];
  Usage readUsages [10];
  Usage local_88 [2];
  Usage usages [12];
  VkDeviceSize sizes [4];
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"pipeline_barrier","Pipeline barrier tests.");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar4
            );
  usages[10] = USAGE_INDIRECT_BUFFER;
  usages[0xb] = 0;
  memcpy(local_88,&DAT_01359d00,0x30);
  memcpy(writeUsages,&DAT_01359d30,0x28);
  for (uStack_c8 = 0; uStack_c8 < 2; uStack_c8 = uStack_c8 + 1) {
    UVar1 = writeUsages[uStack_c8 - 2];
    for (_usage = 0; _usage < 10; _usage = _usage + 1) {
      UVar3 = anon_unknown_0::operator|(UVar1,writeUsages[_usage]);
      (anonymous_namespace)::usageToName_abi_cxx11_
                ((string *)
                 &usageGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(_anonymous_namespace_ *)(ulong)UVar3,usage_00);
      pTVar4 = (TestCaseGroup *)operator_new(0x70);
      uVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data._8_8_;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar2,pcVar5,pcVar6);
      de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&sizeNdx + 7));
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_110,
                 pTVar4);
      for (size = 0; size < 4; size = size + 1) {
        config._16_8_ = sizes[size - 1];
        testName.field_2._8_8_ = config._16_8_;
        de::toString<unsigned_long>((string *)local_148,(unsigned_long *)&config.sharing);
        config._0_8_ = testName.field_2._8_8_;
        config.size._0_4_ = 0;
        all = UVar3;
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_110)->super_TestNode;
        pIVar8 = (InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
                  *)operator_new(0x90);
        InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
        ::InstanceFactory1(pIVar8,(TestContext *)
                                  group.
                                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                  .m_data._8_8_,NODETYPE_SELF_VALIDATE,(string *)local_148,
                           (string *)local_148,(AddPrograms *)((long)&usageNdx + 7),
                           (TestConfig_conflict1 *)&all);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
        std::__cxx11::string::~string((string *)local_148);
      }
      pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_20)->super_TestNode;
      pTVar9 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_110)->super_TestNode;
      tcu::TestNode::addChild(pTVar7,pTVar9);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::release
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_110);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_110);
      std::__cxx11::string::~string
                ((string *)
                 &usageGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
    }
  }
  usageNdx._0_4_ = 0;
  for (usageGroupName_1.field_2._8_8_ = 0; (ulong)usageGroupName_1.field_2._8_8_ < 0xc;
      usageGroupName_1.field_2._8_8_ = usageGroupName_1.field_2._8_8_ + 1) {
    usageNdx._0_4_ =
         anon_unknown_0::operator|((Usage)usageNdx,local_88[usageGroupName_1.field_2._8_8_]);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"all",
             (allocator<char> *)
             &usageGroup_1.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &usageGroup_1.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  uVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
          ._8_8_;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar2,pcVar5,pcVar6);
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&sizeNdx_1 + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1b0,
             pTVar4);
  for (size_1 = 0; size_1 < 4; size_1 = size_1 + 1) {
    config_1._16_8_ = sizes[size_1 - 1];
    testName_1.field_2._8_8_ = config_1._16_8_;
    de::toString<unsigned_long>((string *)local_1e8,(unsigned_long *)&config_1.sharing);
    local_208._0_4_ = (Usage)usageNdx;
    config_1._0_8_ = testName_1.field_2._8_8_;
    config_1.size._0_4_ = 0;
    pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_1b0)->super_TestNode;
    pIVar8 = (InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
              *)operator_new(0x90);
    InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
    ::InstanceFactory1(pIVar8,(TestContext *)
                              group.
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              .m_data._8_8_,NODETYPE_SELF_VALIDATE,(string *)local_1e8,
                       (string *)local_1e8,
                       (AddPrograms *)(usageGroupName_2.field_2._M_local_buf + 0xf),
                       (TestConfig_conflict1 *)local_208);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar9 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1b0
               )->super_TestNode;
  tcu::TestNode::addChild(pTVar7,pTVar9);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::release
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1b0);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1b0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"all_device",
             (allocator<char> *)
             &usageGroup_2.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &usageGroup_2.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  uVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
          ._8_8_;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar2,pcVar5,pcVar6);
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&sizeNdx_2 + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_248,
             pTVar4);
  for (size_2 = 0; size_2 < 4; size_2 = size_2 + 1) {
    config_2._16_8_ = sizes[size_2 - 1];
    testName_2.field_2._8_8_ = config_2._16_8_;
    de::toString<unsigned_long>((string *)local_280,(unsigned_long *)&config_2.sharing);
    UVar1 = (Usage)usageNdx;
    UVar3 = anon_unknown_0::operator|(USAGE_HOST_READ,USAGE_HOST_WRITE);
    local_2a0._0_4_ = UVar1 & ~UVar3;
    config_2._0_8_ = testName_2.field_2._8_8_;
    config_2.size._0_4_ = 0;
    pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_248)->super_TestNode;
    pIVar8 = (InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
              *)operator_new(0x90);
    InstanceFactory1<vkt::memory::(anonymous_namespace)::MemoryTestInstance,_vkt::memory::(anonymous_namespace)::TestConfig,_vkt::memory::(anonymous_namespace)::AddPrograms>
    ::InstanceFactory1(pIVar8,(TestContext *)
                              group.
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              .m_data._8_8_,NODETYPE_SELF_VALIDATE,(string *)local_280,
                       (string *)local_280,&local_2a1,(TestConfig_conflict1 *)local_2a0);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pIVar8);
    std::__cxx11::string::~string((string *)local_280);
  }
  pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar9 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_248
               )->super_TestNode;
  tcu::TestNode::addChild(pTVar7,pTVar9);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::release
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_248);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_248);
  std::__cxx11::string::~string(local_230);
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createPipelineBarrierTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "pipeline_barrier", "Pipeline barrier tests."));
	const vk::VkDeviceSize			sizes[]			=
	{
		1024,		// 1K
		8*1024,		// 8K
		64*1024,	// 64K
		1024*1024,	// 1M
	};
	const Usage						usages[]		=
	{
		USAGE_HOST_READ,
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_SRC,
		USAGE_TRANSFER_DST,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};
	const Usage						readUsages[]		=
	{
		USAGE_HOST_READ,
		USAGE_TRANSFER_SRC,
		USAGE_VERTEX_BUFFER,
		USAGE_INDEX_BUFFER,
		USAGE_UNIFORM_BUFFER,
		USAGE_UNIFORM_TEXEL_BUFFER,
		USAGE_STORAGE_BUFFER,
		USAGE_STORAGE_TEXEL_BUFFER,
		USAGE_STORAGE_IMAGE,
		USAGE_SAMPLED_IMAGE
	};

	const Usage						writeUsages[]	=
	{
		USAGE_HOST_WRITE,
		USAGE_TRANSFER_DST
	};

	for (size_t writeUsageNdx = 0; writeUsageNdx < DE_LENGTH_OF_ARRAY(writeUsages); writeUsageNdx++)
	{
		const Usage	writeUsage	= writeUsages[writeUsageNdx];

		for (size_t readUsageNdx = 0; readUsageNdx < DE_LENGTH_OF_ARRAY(readUsages); readUsageNdx++)
		{
			const Usage						readUsage		= readUsages[readUsageNdx];
			const Usage						usage			= writeUsage | readUsage;
			const string					usageGroupName	(usageToName(usage));
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					usage,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	{
		Usage all = (Usage)0;

		for (size_t usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
			all = all | usages[usageNdx];

		{
			const string					usageGroupName	("all");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					all,
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}

		{
			const string					usageGroupName	("all_device");
			de::MovePtr<tcu::TestCaseGroup>	usageGroup		(new tcu::TestCaseGroup(testCtx, usageGroupName.c_str(), usageGroupName.c_str()));

			for (size_t sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
			{
				const vk::VkDeviceSize	size		= sizes[sizeNdx];
				const string			testName	(de::toString((deUint64)(size)));
				const TestConfig		config		=
				{
					(Usage)(all & (~(USAGE_HOST_READ|USAGE_HOST_WRITE))),
					size,
					vk::VK_SHARING_MODE_EXCLUSIVE
				};

				usageGroup->addChild(new InstanceFactory1<MemoryTestInstance, TestConfig, AddPrograms>(testCtx,tcu::NODETYPE_SELF_VALIDATE,  testName, testName, AddPrograms(), config));
			}

			group->addChild(usageGroup.get());
			usageGroup.release();
		}
	}

	return group.release();
}